

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

CrispyValue ht_get(HashTable *ht,HTItemKey key)

{
  HTKeyType type;
  _Bool _Var1;
  uint32_t uVar2;
  ulong uVar3;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar4;
  HTItemKey *pHVar5;
  CrispyValue CVar6;
  
  uVar2 = hash(key,ht->key_type);
  pHVar5 = &ht->buckets[ht->cap - 1 & uVar2]->key;
  if (pHVar5 != (HTItemKey *)0x0) {
    type = ht->key_type;
    do {
      _Var1 = equals(*pHVar5,key,type);
      if (_Var1) {
        pHVar5 = pHVar5 + 1;
        goto LAB_00102602;
      }
      pHVar5 = (HTItemKey *)pHVar5[2].key_obj_string;
    } while (pHVar5 != (HTItemKey *)0x0);
    pHVar5 = (HTItemKey *)0x0;
LAB_00102602:
    if (pHVar5 != (HTItemKey *)0x0) {
      uVar3 = (ulong)pHVar5->key_int;
      aVar4 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(pHVar5->field_0).ident_length;
      goto LAB_0010261b;
    }
  }
  uVar3 = 0;
  aVar4.d_value = 0.0;
LAB_0010261b:
  CVar6.field_1.d_value = aVar4.d_value;
  CVar6._0_8_ = uVar3;
  return CVar6;
}

Assistant:

CrispyValue ht_get(HashTable *ht, HTItemKey key) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        CrispyValue *value = find(ht->buckets[index], key, ht->key_type);
        if (value) {
            return *value;
        }
    }

    CrispyValue v;
    v.type = NIL;
    v.p_value = 0;
    return v;
}